

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

size_t __thiscall
vectorstr_hash::operator()
          (vectorstr_hash *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *p)

{
  pointer pbVar1;
  size_t sVar2;
  long lVar3;
  int j;
  size_type sVar4;
  
  pbVar1 = (p->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar2 = 1;
  for (lVar3 = 0;
      lVar3 != (long)(p->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      lVar3 = lVar3 + 1) {
    for (sVar4 = 0; pbVar1[lVar3]._M_string_length != sVar4; sVar4 = sVar4 + 1) {
      sVar2 = (long)(sVar2 * (long)pbVar1[lVar3]._M_dataplus._M_p[sVar4]) % 0x5f5e0fd;
    }
  }
  return sVar2;
}

Assistant:

std::size_t operator () (const std::vector<string> &p) const
	{
		long long hash_value = 1;
		for (auto i = 0; i < p.size(); i ++)
			for (auto j = 0; j < p[i].size(); j ++)
				hash_value = (long long) hash_value * (long long) p[i][j] % 99999997LL;

		return (size_t) hash_value;
	}